

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraZddPrimes(DdManager *dd,DdNode *F)

{
  uint uVar1;
  DdNode *f;
  DdNode *g;
  DdNode *F_00;
  DdNode *P;
  DdNode *P_00;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *pDStack_58;
  int fIsComp;
  DdNode *zResN;
  DdNode *zResP;
  DdNode *zResE;
  DdNode *zP1;
  DdNode *zP0;
  DdNode *bF01;
  DdNode *zRes;
  DdNode *F_local;
  DdManager *dd_local;
  
  if (F == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (F == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1Zdd(dd,extraZddPrimes,F);
    if (dd_local == (DdManager *)0x0) {
      uVar1 = (uint)F & 1;
      f = (DdNode *)(*(ulong *)(((ulong)F & 0xfffffffffffffffe) + 0x18) ^ (long)(int)uVar1);
      g = (DdNode *)(*(ulong *)(((ulong)F & 0xfffffffffffffffe) + 0x10) ^ (long)(int)uVar1);
      F_00 = cuddBddAndRecur(dd,f,g);
      if (F_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) + 1;
        P = extraZddPrimes(dd,f);
        if (P == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,F_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) + 1;
          P_00 = extraZddPrimes(dd,g);
          if (P_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,F_00);
            Cudd_RecursiveDerefZdd(dd,P);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)P_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)P_00 & 0xfffffffffffffffe) + 4) + 1;
            if (F_00 == f) {
              *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) + -1;
              pDStack_58 = dd->zero;
              *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) + 1;
              zResN = cuddZddDiff(dd,P_00,P);
              if (zResN == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,P);
                Cudd_RecursiveDerefZdd(dd,pDStack_58);
                Cudd_RecursiveDerefZdd(dd,P_00);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,P_00);
              zResP = P;
            }
            else if (F_00 == g) {
              *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)F_00 & 0xfffffffffffffffe) + 4) + -1;
              zResN = dd->zero;
              *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) + 1;
              pDStack_58 = cuddZddDiff(dd,P,P_00);
              if (pDStack_58 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,P_00);
                Cudd_RecursiveDerefZdd(dd,zResN);
                Cudd_RecursiveDerefZdd(dd,P);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,P);
              zResP = P_00;
            }
            else {
              zResP = extraZddPrimes(dd,F_00);
              if (zResP == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,F_00);
                Cudd_RecursiveDerefZdd(dd,P);
                Cudd_RecursiveDerefZdd(dd,P_00);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)zResP & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zResP & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(dd,F_00);
              pDStack_58 = cuddZddDiff(dd,P,zResP);
              if (pDStack_58 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,zResP);
                Cudd_RecursiveDerefZdd(dd,P);
                Cudd_RecursiveDerefZdd(dd,P_00);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDStack_58 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,P);
              zResN = cuddZddDiff(dd,P_00,zResP);
              if (zResN == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd(dd,zResP);
                Cudd_RecursiveDerefZdd(dd,pDStack_58);
                Cudd_RecursiveDerefZdd(dd,P_00);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zResN & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDerefZdd(dd,P_00);
            }
            dd_local = (DdManager *)
                       extraComposeCover(dd,pDStack_58,zResN,zResP,
                                         *(int *)((ulong)F & 0xfffffffffffffffe));
            if (dd_local == (DdManager *)0x0) {
              dd_local = (DdManager *)0x0;
            }
            else {
              cuddCacheInsert1(dd,extraZddPrimes,F,(DdNode *)dd_local);
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode* extraZddPrimes( DdManager *dd, DdNode* F )
{
	DdNode *zRes;

	if ( F == Cudd_Not( dd->one ) )
		return dd->zero;
	if ( F == dd->one )
		return dd->one;

    /* check cache */
    zRes = cuddCacheLookup1Zdd(dd, extraZddPrimes, F);
    if (zRes)
    	return(zRes);
	{
		/* temporary variables */
		DdNode *bF01, *zP0, *zP1;
		/* three components of the prime set */
		DdNode *zResE, *zResP, *zResN;
		int fIsComp = Cudd_IsComplement( F );

		/* find cofactors of F */
		DdNode * bF0 = Cudd_NotCond( Cudd_E( F ), fIsComp );
		DdNode * bF1 = Cudd_NotCond( Cudd_T( F ), fIsComp );

		/* find the intersection of cofactors */
		bF01 = cuddBddAndRecur( dd, bF0, bF1 );
		if ( bF01 == NULL ) return NULL;
		cuddRef( bF01 );

		/* solve the problems for cofactors */
		zP0 = extraZddPrimes( dd, bF0 );
		if ( zP0 == NULL )
		{
			Cudd_RecursiveDeref( dd, bF01 );
			return NULL;
		}
		cuddRef( zP0 );

		zP1 = extraZddPrimes( dd, bF1 );
		if ( zP1 == NULL )
		{
			Cudd_RecursiveDeref( dd, bF01 );
			Cudd_RecursiveDerefZdd( dd, zP0 );
			return NULL;
		}
		cuddRef( zP1 );

		/* check for local unateness */
		if ( bF01 == bF0 )       /* unate increasing */
		{
			/* intersection is useless */
			cuddDeref( bF01 );
			/* the primes of intersection are the primes of F0 */
			zResE = zP0;
			/* there are no primes with negative var */
			zResN = dd->zero;
			cuddRef( zResN );
			/* primes with positive var are primes of F1 that are not primes of F01 */
			zResP = cuddZddDiff( dd, zP1, zP0 );
			if ( zResP == NULL )  
			{
				Cudd_RecursiveDerefZdd( dd, zResE );
				Cudd_RecursiveDerefZdd( dd, zResN );
				Cudd_RecursiveDerefZdd( dd, zP1 );
				return NULL;
			}
			cuddRef( zResP );
			Cudd_RecursiveDerefZdd( dd, zP1 );
		}
		else if ( bF01 == bF1 ) /* unate decreasing */
		{
			/* intersection is useless */
			cuddDeref( bF01 );
			/* the primes of intersection are the primes of F1 */
			zResE = zP1;
			/* there are no primes with positive var */
			zResP = dd->zero;
			cuddRef( zResP );
			/* primes with negative var are primes of F0 that are not primes of F01 */
			zResN = cuddZddDiff( dd, zP0, zP1 );
			if ( zResN == NULL )  
			{
				Cudd_RecursiveDerefZdd( dd, zResE );
				Cudd_RecursiveDerefZdd( dd, zResP );
				Cudd_RecursiveDerefZdd( dd, zP0 );
				return NULL;
			}
			cuddRef( zResN );
			Cudd_RecursiveDerefZdd( dd, zP0 );
		}
		else /* not unate */
		{
			/* primes without the top var are primes of F10 */
			zResE = extraZddPrimes( dd, bF01 );
			if ( zResE == NULL )  
			{
				Cudd_RecursiveDerefZdd( dd, bF01 );
				Cudd_RecursiveDerefZdd( dd, zP0 );
				Cudd_RecursiveDerefZdd( dd, zP1 );
				return NULL;
			}
			cuddRef( zResE );
			Cudd_RecursiveDeref( dd, bF01 );

			/* primes with the negative top var are those of P0 that are not in F10 */
			zResN = cuddZddDiff( dd, zP0, zResE );
			if ( zResN == NULL )  
			{
				Cudd_RecursiveDerefZdd( dd, zResE );
				Cudd_RecursiveDerefZdd( dd, zP0 );
				Cudd_RecursiveDerefZdd( dd, zP1 );
				return NULL;
			}
			cuddRef( zResN );
			Cudd_RecursiveDerefZdd( dd, zP0 );

			/* primes with the positive top var are those of P1 that are not in F10 */
			zResP = cuddZddDiff( dd, zP1, zResE );
			if ( zResP == NULL )  
			{
				Cudd_RecursiveDerefZdd( dd, zResE );
				Cudd_RecursiveDerefZdd( dd, zResN );
				Cudd_RecursiveDerefZdd( dd, zP1 );
				return NULL;
			}
			cuddRef( zResP );
			Cudd_RecursiveDerefZdd( dd, zP1 );
		}

		zRes = extraComposeCover( dd, zResN, zResP, zResE, Cudd_Regular(F)->index );
		if ( zRes == NULL ) return NULL;

		/* insert the result into cache */
		cuddCacheInsert1(dd, extraZddPrimes, F, zRes);
		return zRes;
	}
}